

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover_reset.cc
# Opt level: O0

int runReset(string *command,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  const_iterator os;
  const_iterator command_00;
  ostream *poVar3;
  pointer ppVar4;
  uint64_t hardware_addr;
  size_t __n;
  void *__buf;
  int in_ESI;
  size_t sVar5;
  bool in_stack_000000d5;
  bool in_stack_000000d6;
  bool in_stack_000000d7;
  WOL wol;
  DeviceInfo *device;
  const_iterator __end1;
  const_iterator __begin1;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *__range1;
  string answer;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> devices;
  invalid_argument *ex;
  string p;
  int i;
  const_iterator reset_command;
  string argv_0;
  bool yes;
  DeviceFilter device_filter;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>_>
  *in_stack_fffffffffffffda8;
  DeviceFilter *in_stack_fffffffffffffdb0;
  WOL *in_stack_fffffffffffffdc0;
  allocator<char> *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffe28;
  ostream *in_stack_fffffffffffffe30;
  undefined1 local_184;
  undefined1 local_183;
  undefined1 local_182;
  uint8_t local_181;
  undefined1 local_180 [72];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  allocator<char> local_111;
  string local_110 [8];
  DeviceFilter *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff10;
  int iVar6;
  const_iterator argv_00;
  const_iterator cVar7;
  allocator<char> local_d1;
  string local_d0 [32];
  int local_b0;
  byte local_99;
  undefined1 local_98 [24];
  undefined1 auStack_80 [24];
  undefined1 auStack_68 [24];
  undefined1 auStack_50 [24];
  undefined1 auStack_38 [36];
  int local_14;
  int local_4;
  
  local_14 = in_ESI;
  memset(local_98,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x137b67);
  memset(auStack_80,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x137b94);
  memset(auStack_68,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x137bc1);
  memset(auStack_50,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x137bee);
  memset(auStack_38,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x137c1b);
  local_99 = 0;
  if (local_14 == 0) {
    std::operator<<((ostream *)&std::cerr,"No operation specified\n");
    printHelp(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_4 = 1;
    local_b0 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::allocator<char>::~allocator(&local_d1);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8), bVar1
       )) {
      printHelp(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      local_4 = 0;
      local_b0 = 1;
    }
    else {
      os = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>_>
           ::find(in_stack_fffffffffffffda8,(key_type *)0x137db8);
      cVar7 = os;
      command_00 = std::
                   end<std::map<std::__cxx11::string,ResetCommand,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ResetCommand>>>>
                             (in_stack_fffffffffffffda8);
      argv_00 = command_00;
      bVar1 = std::operator==((_Self *)&stack0xffffffffffffff20,(_Self *)&stack0xffffffffffffff18);
      if (bVar1) {
        std::operator<<((ostream *)&std::cout,"Invalid operation specified\n");
        printHelp((ostream *)os._M_node,(string *)command_00._M_node);
        local_4 = 1;
        local_b0 = 1;
      }
      else {
        iVar6 = 1;
        do {
          if (local_14 <= iVar6) {
            bVar1 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffdc0);
            if (((!bVar1) ||
                (bVar1 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)in_stack_fffffffffffffdc0), !bVar1)) ||
               (bVar1 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffffdc0), !bVar1)) {
              discoverWithFilter(in_stack_fffffffffffffef8);
              bVar1 = std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::
                      empty((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                             *)in_stack_fffffffffffffdc0);
              if (bVar1) {
                poVar3 = std::operator<<((ostream *)&std::cout,"No device found");
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                local_4 = 0;
                local_b0 = 1;
                goto LAB_00138598;
              }
              ppVar4 = std::
                       _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>
                       ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>
                                     *)0x1382ec);
              poVar3 = std::operator<<((ostream *)&std::cout,(string *)&(ppVar4->second).action);
              std::operator<<(poVar3," of the following devices:\n");
              __n = 0;
              sVar5 = __n;
              printDeviceTable((ostream *)device,
                               (vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                *)wol,in_stack_000000d7,in_stack_000000d6,in_stack_000000d5);
              if ((local_99 & 1) == 0) {
                std::operator<<((ostream *)&std::cout,"Are you sure? [y/N] ");
                std::__cxx11::string::string((string *)(local_180 + 0x28));
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&std::cin,(string *)(local_180 + 0x28));
                bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffffdb0,
                                        (char *)in_stack_fffffffffffffda8);
                if ((bVar1) &&
                   (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_fffffffffffffdb0,
                                            (char *)in_stack_fffffffffffffda8), bVar1)) {
                  in_stack_fffffffffffffdc0 = (WOL *)std::operator<<((ostream *)&std::cout,"Cancel")
                  ;
                  std::ostream::operator<<
                            (in_stack_fffffffffffffdc0,std::endl<char,std::char_traits<char>>);
                  local_4 = 0;
                  local_b0 = 1;
                }
                else {
                  local_b0 = 0;
                }
                std::__cxx11::string::~string((string *)(local_180 + 0x28));
                if (local_b0 != 0) goto LAB_00138598;
              }
              local_180._32_8_ = &local_138;
              local_180._24_8_ =
                   std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::
                   begin((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                         in_stack_fffffffffffffda8);
              local_180._16_8_ =
                   std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::end
                             ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                               *)in_stack_fffffffffffffda8);
              while (bVar1 = __gnu_cxx::operator!=
                                       ((__normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                                         *)in_stack_fffffffffffffdb0,
                                        (__normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                                         *)in_stack_fffffffffffffda8), bVar1) {
                local_180._8_8_ =
                     __gnu_cxx::
                     __normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                     ::operator*((__normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                                  *)(local_180 + 0x18));
                hardware_addr = rcdiscover::DeviceInfo::getMAC((DeviceInfo *)local_180._8_8_);
                in_stack_fffffffffffffdb0 = (DeviceFilter *)local_180;
                rcdiscover::WOL::WOL
                          (in_stack_fffffffffffffdc0,hardware_addr,
                           (uint16_t)((ulong)in_stack_fffffffffffffdb0 >> 0x30));
                local_184 = 0xee;
                local_183 = 0xee;
                local_182 = 0xee;
                ppVar4 = std::
                         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>
                         ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>
                                       *)0x138525);
                local_181 = (ppVar4->second).id;
                rcdiscover::WOL::send
                          ((WOL *)in_stack_fffffffffffffdb0,(int)&local_184,__buf,__n,(int)sVar5);
                __gnu_cxx::
                __normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                ::operator++((__normal_iterator<const_rcdiscover::DeviceInfo_*,_std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>_>
                              *)(local_180 + 0x18));
              }
              poVar3 = std::operator<<((ostream *)&std::cout,"Done");
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              local_4 = 0;
              local_b0 = 1;
LAB_00138598:
              std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector
                        ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                         in_stack_fffffffffffffdc0);
              break;
            }
            poVar3 = std::operator<<((ostream *)&std::cerr,"No filter set");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            printHelp((ostream *)os._M_node,(string *)command_00._M_node);
            local_4 = 1;
            local_b0 = 1;
            break;
          }
          iVar6 = iVar6 + 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
          std::allocator<char>::~allocator(&local_111);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
          if (bVar1) {
            local_99 = 1;
LAB_00138172:
            local_b0 = 0;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
            if (bVar1) {
              iVar2 = parseFilterArguments
                                ((int)((ulong)cVar7._M_node >> 0x20),(char **)argv_00._M_node,
                                 (DeviceFilter *)CONCAT44(iVar6,in_stack_ffffffffffffff10));
              iVar6 = iVar2 + iVar6;
              goto LAB_00138172;
            }
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
            if ((bVar1) ||
               (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffffdb0,
                                        (char *)in_stack_fffffffffffffda8), bVar1)) {
              printHelp((ostream *)os._M_node,(string *)command_00._M_node);
              local_4 = 0;
              local_b0 = 1;
            }
            else {
              poVar3 = std::operator<<((ostream *)&std::cerr,"Invalid argument: ");
              in_stack_fffffffffffffdf0 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::operator<<(poVar3,local_110);
              std::operator<<((ostream *)in_stack_fffffffffffffdf0,'\n');
              printHelp((ostream *)os._M_node,(string *)command_00._M_node);
              local_4 = 1;
              local_b0 = 1;
            }
          }
          std::__cxx11::string::~string(local_110);
        } while (local_b0 == 0);
      }
    }
    std::__cxx11::string::~string(local_d0);
  }
  DeviceFilter::~DeviceFilter(in_stack_fffffffffffffdb0);
  return local_4;
}

Assistant:

int runReset(const std::string &command, int argc, char **argv)
{
  DeviceFilter device_filter{};
  bool yes = false;

  if (argc == 0)
  {
    std::cerr << "No operation specified\n";
    printHelp(std::cerr, command);
    return 1;
  }

  const std::string argv_0 = argv[0];
  if (argv_0 == "-h" || argv_0 == "--help")
  {
    printHelp(std::cout, command);
    return 0;
  }

  const auto reset_command = reset_commands.find(argv_0);
  if (reset_command == std::end(reset_commands))
  {
    std::cout << "Invalid operation specified\n";
    printHelp(std::cerr, command);
    return 1;
  }

  int i = 1;
  while (i < argc)
  {
    std::string p = argv[i++];

    if (p == "-y")
    {
      yes = true;
    }
    else if (p == "-f")
    {
      try
      {
        i += parseFilterArguments(argc - i, argv + i, device_filter);
      }
      catch (const std::invalid_argument &ex)
      {
        std::cerr << ex.what() << std::endl;
        printHelp(std::cerr, command);
        return 1;
      }
    }
    else if (p == "-h" || p == "--help")
    {
      printHelp(std::cout, command);
      return 0;
    }
    else
    {
      std::cerr << "Invalid argument: " << p << '\n';
      printHelp(std::cerr, command);
      return 1;
    }
  }

  if (device_filter.mac.empty() &&
      device_filter.name.empty() &&
      device_filter.serial.empty())
  {
    std::cerr << "No filter set" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }
  const auto devices = discoverWithFilter(device_filter);

  if (devices.empty())
  {
    std::cout << "No device found" << std::endl;
    return 0;
  }

  std::cout << reset_command->second.action << " of the following devices:\n";
  printDeviceTable(std::cout, devices, true, false, false);

  if (!yes)
  {
    std::cout << "Are you sure? [y/N] ";
    std::string answer;
    std::getline(std::cin, answer);
    if (answer != "y" && answer != "Y")
    {
      std::cout << "Cancel" << std::endl;
      return 0;
    }
  }

  for (const auto &device : devices)
  {
    rcdiscover::WOL wol(device.getMAC(), 9);
    wol.send({{0xEE, 0xEE, 0xEE, reset_command->second.id}});
  }

  std::cout << "Done" << std::endl;

  return 0;
}